

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O2

VarId __thiscall optimization::loop_unrolling::loop_info::copy_var(loop_info *this,VarId *var)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  *this_00;
  int iVar1;
  long lVar2;
  mapped_type *__y;
  long in_RDX;
  undefined8 extraout_RDX;
  VarId VVar3;
  pair<const_unsigned_int,_mir::inst::Variable> local_40;
  
  this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
             *)(*(long *)&var->id + 0x38);
  lVar2 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(*(long *)&var->id + 0x40));
  iVar1 = *(int *)(lVar2 + 0x20);
  *(undefined ***)this = &PTR_display_001d90d0;
  *(int *)&this->func = iVar1 + 1;
  __y = std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              *)this_00,(key_type_conflict *)(in_RDX + 8));
  std::pair<const_unsigned_int,_mir::inst::Variable>::
  pair<mir::inst::VarId_&,_mir::inst::Variable_&,_true>(&local_40,(VarId *)this,__y);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>(this_00,&local_40);
  mir::inst::Variable::~Variable(&local_40.second);
  VVar3._8_8_ = extraout_RDX;
  VVar3.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar3;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    auto end_iter = func.variables.end();
    end_iter--;
    mir::inst::VarId new_var(end_iter->first + 1);
    func.variables.insert({new_var, func.variables.at(var.id)});
    return new_var;
  }